

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O3

xmlChar * getAttribute(xmlNodePtr node,xmlChar *name)

{
  _xmlAttr *p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  
  p_Var1 = node->properties;
  while( true ) {
    if (p_Var1 == (_xmlAttr *)0x0) {
      return (xmlChar *)0x0;
    }
    iVar2 = xmlStrEqual(p_Var1->name,name);
    if (iVar2 != 0) break;
    p_Var1 = p_Var1->next;
  }
  pxVar3 = (xmlChar *)xmlNodeGetContent(p_Var1);
  return pxVar3;
}

Assistant:

static xmlChar* getAttribute(xmlNodePtr node, const xmlChar* name) {
    xmlAttr *attr = node->properties;
    while (attr) {
        if (xmlStrEqual(attr->name, name)) {
            return xmlNodeGetContent((xmlNode*)attr);
        }
        attr = attr->next;
    }

    return NULL;
}